

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage_manager.cpp
# Opt level: O1

DatabaseSize * __thiscall
duckdb::SingleFileStorageManager::GetDatabaseSize
          (DatabaseSize *__return_storage_ptr__,SingleFileStorageManager *this)

{
  unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true> *this_00;
  int iVar1;
  pointer pBVar2;
  idx_t iVar3;
  idx_t iVar4;
  undefined4 extraout_var_00;
  pointer pWVar5;
  undefined4 extraout_var;
  
  __return_storage_ptr__->bytes = 0;
  __return_storage_ptr__->wal_size = 0;
  __return_storage_ptr__->free_blocks = 0;
  __return_storage_ptr__->used_blocks = 0;
  __return_storage_ptr__->total_blocks = 0;
  __return_storage_ptr__->block_size = 0;
  iVar1 = ::std::__cxx11::string::compare((char *)&(this->super_StorageManager).path);
  if (iVar1 != 0) {
    this_00 = &this->block_manager;
    pBVar2 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
             operator->(this_00);
    iVar1 = (*pBVar2->_vptr_BlockManager[0x10])(pBVar2);
    iVar3 = CONCAT44(extraout_var,iVar1);
    __return_storage_ptr__->total_blocks = iVar3;
    pBVar2 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
             operator->(this_00);
    iVar4 = optional_idx::GetIndex(&pBVar2->block_alloc_size);
    __return_storage_ptr__->block_size = iVar4;
    pBVar2 = unique_ptr<duckdb::BlockManager,_std::default_delete<duckdb::BlockManager>,_true>::
             operator->(this_00);
    iVar1 = (*pBVar2->_vptr_BlockManager[0x11])(pBVar2);
    __return_storage_ptr__->free_blocks = CONCAT44(extraout_var_00,iVar1);
    __return_storage_ptr__->used_blocks = iVar3 - CONCAT44(extraout_var_00,iVar1);
    __return_storage_ptr__->bytes = iVar4 * iVar3;
    pWVar5 = unique_ptr<duckdb::WriteAheadLog,_std::default_delete<duckdb::WriteAheadLog>,_true>::
             operator->(&(this->super_StorageManager).wal);
    __return_storage_ptr__->wal_size = (pWVar5->wal_size).super___atomic_base<unsigned_long>._M_i;
  }
  return __return_storage_ptr__;
}

Assistant:

DatabaseSize SingleFileStorageManager::GetDatabaseSize() {
	// All members default to zero
	DatabaseSize ds;
	if (!InMemory()) {
		ds.total_blocks = block_manager->TotalBlocks();
		ds.block_size = block_manager->GetBlockAllocSize();
		ds.free_blocks = block_manager->FreeBlocks();
		ds.used_blocks = ds.total_blocks - ds.free_blocks;
		ds.bytes = (ds.total_blocks * ds.block_size);
		ds.wal_size = NumericCast<idx_t>(GetWALSize());
	}
	return ds;
}